

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O1

void __thiscall soplex::SPxBasisBase<double>::addedRows(SPxBasisBase<double> *this,int n)

{
  int iVar1;
  SPxId *pSVar2;
  int iVar3;
  Status SVar4;
  uint uVar5;
  undefined8 *puVar6;
  long lVar7;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  DataKey local_30;
  
  if (0 < n) {
    reDim(this);
    iVar1 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    iVar3 = iVar1 - n;
    if (this->theLP->theRep == COLUMN) {
      if (iVar3 < iVar1) {
        lVar7 = (long)iVar3;
        do {
          SVar4 = dualRowStatus(this,(int)lVar7);
          (this->thedesc).rowstat.data[lVar7] = SVar4;
          local_30 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thekey[lVar7];
          SPxRowId::SPxRowId((SPxRowId *)&local_50,&local_30);
          pSVar2 = (this->theBaseId).data;
          pSVar2[lVar7].super_DataKey = local_50;
          pSVar2[lVar7].super_DataKey.info = -1;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                         super_SVSetBase<double>.set.thenum);
      }
    }
    else if (iVar3 < iVar1) {
      lVar7 = (long)iVar3;
      do {
        SVar4 = dualRowStatus(this,(int)lVar7);
        (this->thedesc).rowstat.data[lVar7] = SVar4;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    if ((NO_PROBLEM < this->thestatus) && (this->matrixIsSetup == true)) {
      loadMatrixVecs(this);
    }
    uVar5 = this->thestatus + PRIMAL;
    if (7 < uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ECHBAS04 Unknown basis status!",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XCHBAS01 This should never happen.","");
      *puVar6 = &PTR__SPxException_006a9ee8;
      puVar6[1] = puVar6 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar6 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if ((0xfU >> (uVar5 & 0x1f) & 1) == 0) {
      this->thestatus = (uint)((0x50U >> (uVar5 & 0x1f) & 1) == 0);
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedRows(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::COLUMN)
      {
         /* after adding rows in column representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
         {
            thedesc.rowStatus(i) = dualRowStatus(i);
            baseId(i) = theLP->SPxLPBase<R>::rId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::ROW);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
            thedesc.rowStatus(i) = dualRowStatus(i);
      }

      /* If matrix was set up, load new basis vectors to the matrix.
       * In the row case, the basis is not effected by adding rows. However,
       * since @c matrix stores references to the rows in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only row have been added, since the basis
       * matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      /* update basis status */
      switch(status())
      {
      case PRIMAL:
      case UNBOUNDED:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case INFEASIBLE:
         setStatus(DUAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case DUAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS04 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS01 This should never happen.");
      }
   }
}